

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O2

void Wlc_NtkCollectStats(Wlc_Ntk_t *p,int (*nObjs) [60])

{
  Wlc_Obj_t *pWVar1;
  int Id;
  long lVar2;
  
  if ((p->vPos).nSize == 2) {
    for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
      Wlc_NtkMarkCone(p,(int)lVar2,1,1,0);
      for (Id = 1; Id < p->iObj; Id = Id + 1) {
        pWVar1 = Wlc_NtkObj(p,Id);
        if ((char)*(ushort *)pWVar1 < '\0') {
          nObjs[lVar2][*(ushort *)pWVar1 & 0x3f] = nObjs[lVar2][*(ushort *)pWVar1 & 0x3f] + 1;
        }
      }
    }
    Wlc_NtkCleanMarks(p);
    return;
  }
  return;
}

Assistant:

void Wlc_NtkCollectStats( Wlc_Ntk_t * p, int nObjs[2][WLC_OBJ_NUMBER] )
{
    Wlc_Obj_t * pObj;
    int n, i;
    if ( Wlc_NtkPoNum(p) != 2 )
        return;
    for ( n = 0; n < 2; n++ )
    {
        Wlc_NtkMarkCone( p, n, 1, 1, 0 );
        Wlc_NtkForEachObj( p, pObj, i )
            if ( pObj->Mark )
                nObjs[n][pObj->Type]++;
    }
    Wlc_NtkCleanMarks( p );
}